

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

bool capnp::anon_unknown_2::Indent::canPrintInline(StringTree *text)

{
  size_t sVar1;
  char *pcVar2;
  char local_38 [8];
  char flat [25];
  StringTree *text_local;
  
  unique0x10000094 = text;
  sVar1 = kj::StringTree::size(text);
  if (sVar1 < 0x19) {
    kj::StringTree::flattenTo(stack0xffffffffffffffe8,local_38);
    sVar1 = kj::StringTree::size(stack0xffffffffffffffe8);
    local_38[sVar1] = '\0';
    pcVar2 = strchr(local_38,10);
    if (pcVar2 == (char *)0x0) {
      text_local._7_1_ = true;
    }
    else {
      text_local._7_1_ = false;
    }
  }
  else {
    text_local._7_1_ = false;
  }
  return text_local._7_1_;
}

Assistant:

static bool canPrintInline(const kj::StringTree& text) {
    if (text.size() > maxInlineValueSize) {
      return false;
    }

    char flat[maxInlineValueSize + 1];
    text.flattenTo(flat);
    flat[text.size()] = '\0';
    if (strchr(flat, '\n') != nullptr) {
      return false;
    }

    return true;
  }